

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,longdouble kappa,longdouble delta,longdouble theta,
          longdouble objective_amplifier)

{
  rc_data *__last;
  int k;
  int iVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar2;
  uint r_size;
  bool bVar3;
  _Head_base<0UL,_int_*,_false> _Var4;
  long lVar5;
  uint uVar6;
  rc_data *__first;
  long lVar7;
  rc_data *__last_00;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  undefined1 local_70 [16];
  longdouble local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  local_3c = delta;
  local_48 = kappa;
  if (first._M_current == last._M_current) {
    bVar3 = false;
  }
  else {
    local_54 = theta;
    local_60 = objective_amplifier;
    bVar3 = false;
    do {
      k = (first._M_current)->first;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_70,(int)this + 0x10);
      if (local_70._8_8_ != local_70._0_8_) {
        lVar7 = *(long *)(this + 0x50);
        _Var4._M_head_impl = (int *)local_70._8_8_;
        do {
          iVar1 = *_Var4._M_head_impl;
          _Var4._M_head_impl = _Var4._M_head_impl + 8;
          *(longdouble *)(lVar7 + (long)iVar1 * 0x10) =
               *(longdouble *)(lVar7 + (long)iVar1 * 0x10) * local_54;
        } while (_Var4._M_head_impl != (int *)local_70._0_8_);
      }
      r_size = solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                           *)this,(row_iterator)local_70._8_8_,(row_iterator)local_70._0_8_,x);
      if (r_size != 0) {
        __first = *(rc_data **)(this + 0x58);
        lVar5 = 0;
        lVar7 = *(long *)(*(long *)(this + 0x70) + 8);
        do {
          *(longdouble *)((long)&__first->value + lVar5) =
               *(longdouble *)((long)&__first->value + lVar5) +
               *(longdouble *)(lVar7 + (long)*(int *)((long)&__first->id + lVar5) * 0x10) * local_60
          ;
          lVar5 = lVar5 + 0x20;
        } while ((ulong)r_size << 5 != lVar5);
        if (1 < (int)r_size) {
          lVar7 = (long)(int)r_size;
          __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                 (this + 8);
          __last = __first + lVar7;
          std::
          __introsort_loop<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,__last,(int)LZCOUNT(lVar7) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,__last);
          lVar7 = lVar7 * 0x20 + -0x20;
          __last_00 = __first;
          do {
            __last_00 = __last_00 + 1;
            if ((__first->value != __last_00->value) ||
               (NAN(__first->value) || NAN(__last_00->value))) {
              std::
              shuffle<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,__last_00,__g);
              __first = __last_00;
            }
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != 0);
          std::
          shuffle<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (__first,__last,__g);
        }
      }
      uVar6 = *(uint *)(*(long *)(this + 0x60) + (long)k * 4);
      if ((int)r_size < (int)uVar6) {
        uVar6 = r_size;
      }
      bVar2 = affect<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                          *)this,x,(row_value *)local_70._8_8_,k,uVar6 - 1,r_size,local_48,local_3c)
      ;
      first._M_current = first._M_current + 1;
      bVar3 = (bool)(bVar3 | bVar2);
    } while (first._M_current != last._M_current);
  }
  return bVar3;
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }